

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O0

int __thiscall
vkt::sr::anon_unknown_0::TextureGatherTests::init(TextureGatherTests *this,EVP_PKEY_CTX *ctx)

{
  FilterMode minFilter_00;
  FilterMode magFilter_00;
  TestContext *pTVar1;
  CompareMode CVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  TextureType_conflict TVar6;
  OffsetSize OVar7;
  GatherType GVar8;
  bool bVar9;
  int iVar10;
  void *pvVar11;
  TestNode *pTVar12;
  char *pcVar13;
  char *description;
  TestNode *pTVar14;
  Vector<vkt::sr::(anonymous_namespace)::TextureSwizzleComponent,_4> *pVVar15;
  TextureSwizzleComponent *pTVar16;
  bool bVar17;
  TestNode *local_8d8;
  TestNode *local_8c0;
  char *local_8a0;
  char *local_890;
  TestNode *local_878;
  Vector<int,_3> local_848;
  MaybeTextureSwizzle local_83c;
  TextureFormat local_828;
  allocator<char> local_819;
  string local_818;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f8;
  Vector<int,_3> local_7d8;
  MaybeTextureSwizzle local_7cc;
  TextureFormat local_7b8;
  allocator<char> local_7a9;
  string local_7a8;
  allocator<char> local_781;
  string local_780;
  CompareMode local_75c;
  undefined1 local_758 [4];
  CompareMode compareMode_2;
  undefined1 local_738 [8];
  string caseName_3;
  int baseLevel;
  TestCaseGroup *baseLevelGroup;
  MaybeTextureSwizzle local_6fc;
  TextureFormat local_6e8;
  allocator<char> local_6d9;
  string local_6d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b8;
  Vector<int,_3> local_698;
  MaybeTextureSwizzle local_68c;
  TextureFormat local_678;
  allocator<char> local_669;
  string local_668;
  allocator<char> local_641;
  string local_640;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c0;
  undefined1 local_5a0 [8];
  string caseName_2;
  CompareMode compareMode_1;
  FilterMode magFilter;
  FilterMode minFilter;
  int magFilterNdx;
  int minFilterNdx;
  anon_struct_16_2_3c8bed26 minFilters [5];
  anon_struct_16_2_3c8bed26 magFilters [2];
  TestCaseGroup *filterModeGroup;
  TextureFormat local_4e0;
  allocator<char> local_4d1;
  string local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  Vector<int,_3> local_48c;
  TextureFormat local_480;
  allocator<char> local_471;
  string local_470;
  allocator<char> local_449;
  string local_448;
  string local_428;
  string local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  int local_3c4;
  undefined1 local_3c0 [4];
  int i;
  string caseName_1;
  MaybeTextureSwizzle swizzle;
  int swizzleCaseNdx;
  TestCaseGroup *swizzleGroup;
  TextureFormat local_368;
  allocator<char> local_359;
  string local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  MaybeTextureSwizzle local_314;
  TextureFormat local_300;
  allocator<char> local_2f1;
  string local_2f0;
  allocator<char> local_2c9;
  string local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  undefined1 local_248 [8];
  string caseName;
  WrapMode wrapT;
  WrapMode wrapS;
  int wrapTNdx;
  int wrapSNdx;
  int wrapCaseNdx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  undefined1 local_1a9;
  TestNode *local_1a8;
  TestNode *local_1a0;
  TestCaseGroup *compareModeGroup;
  CompareMode compareMode;
  int compareModeI;
  TestCaseGroup *textureSizeGroup;
  IVec3 *textureSize;
  int textureSizeNdx;
  TestNode *local_170;
  TestCaseGroup *cornersGroup;
  bool noCorners;
  TestNode *pTStack_160;
  int noCornersI;
  TestCaseGroup *formatGroup;
  TextureFormat *format;
  TestNode *pTStack_148;
  int formatNdx;
  TestCaseGroup *textureTypeGroup;
  int local_138;
  TextureType_conflict textureType;
  int textureTypeNdx;
  TestNode *local_128;
  TestCaseGroup *offsetSizeGroup;
  OffsetSize local_118;
  OffsetSize offsetSize;
  int offsetSizeI;
  TestNode *local_108;
  TestCaseGroup *gatherTypeGroup;
  GatherType gatherType;
  int gatherTypeI;
  anon_struct_16_2_3f8b7511 wrapModes [3];
  anon_struct_24_2_3f8e1b6f textureSizes [2];
  anon_struct_16_2_3ce319a5 formats [4];
  anon_struct_16_2_3f8ecaa8 textureTypes [3];
  TextureGatherTests *this_local;
  
  memcpy(&formats[3].format,&DAT_01665da0,0x30);
  textureSizes[1]._16_8_ = (long)", rgba8" + 2;
  tcu::TextureFormat::TextureFormat((TextureFormat *)formats,RGBA,UNORM_INT8);
  formats[0].format = (TextureFormat)anon_var_dwarf_742055;
  tcu::TextureFormat::TextureFormat((TextureFormat *)(formats + 1),RGBA,UNSIGNED_INT8);
  formats[1].format = (TextureFormat)anon_var_dwarf_74206d;
  tcu::TextureFormat::TextureFormat((TextureFormat *)(formats + 2),RGBA,SIGNED_INT8);
  formats[2].format = (TextureFormat)anon_var_dwarf_742085;
  tcu::TextureFormat::TextureFormat((TextureFormat *)(formats + 3),D,FLOAT);
  wrapModes[2]._8_8_ = anon_var_dwarf_742091;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)textureSizes,0x40,0x40,3);
  textureSizes[0]._16_8_ = anon_var_dwarf_74209d;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(textureSizes + 1),0x11,0x17,3);
  pvVar11 = memcpy(&gatherType,&DAT_01665dd0,0x30);
  gatherTypeGroup._4_4_ = GATHERTYPE_BASIC;
  while ((int)gatherTypeGroup._4_4_ < 4) {
    gatherTypeGroup._0_4_ = gatherTypeGroup._4_4_;
    pTVar12 = (TestNode *)operator_new(0x70);
    pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
    pcVar13 = gatherTypeName((GatherType)gatherTypeGroup);
    description = gatherTypeDescription((GatherType)gatherTypeGroup);
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar12,pTVar1,pcVar13,description);
    local_108 = pTVar12;
    tcu::TestNode::addChild((TestNode *)this,pTVar12);
    for (local_118 = OFFSETSIZE_NONE; (int)local_118 < 3;
        local_118 = local_118 + OFFSETSIZE_MINIMUM_REQUIRED) {
      offsetSizeGroup._4_4_ = local_118;
      if ((((GatherType)gatherTypeGroup == GATHERTYPE_BASIC) == (local_118 == OFFSETSIZE_NONE)) &&
         (((GatherType)gatherTypeGroup != GATHERTYPE_OFFSETS ||
          (local_118 != OFFSETSIZE_IMPLEMENTATION_MAXIMUM)))) {
        textureType._3_1_ = TEXTURETYPE_2D >> 0x18;
        if (local_118 == OFFSETSIZE_NONE) {
          local_878 = local_108;
        }
        else {
          local_878 = (TestNode *)operator_new(0x70);
          textureType._3_1_ = 1;
          if (offsetSizeGroup._4_4_ == OFFSETSIZE_MINIMUM_REQUIRED) {
            local_890 = "min_required_offset";
          }
          else {
            local_890 = (char *)0x0;
            if (offsetSizeGroup._4_4_ == OFFSETSIZE_IMPLEMENTATION_MAXIMUM) {
              local_890 = "implementation_offset";
            }
          }
          if (offsetSizeGroup._4_4_ == OFFSETSIZE_MINIMUM_REQUIRED) {
            local_8a0 = "Use offsets within Vulkan minimum required range";
          }
          else {
            local_8a0 = (char *)0x0;
            if (offsetSizeGroup._4_4_ == OFFSETSIZE_IMPLEMENTATION_MAXIMUM) {
              local_8a0 = "Use offsets within the implementation range";
            }
          }
          _textureTypeNdx = local_878;
          tcu::TestCaseGroup::TestCaseGroup
                    ((TestCaseGroup *)local_878,(this->super_TestCaseGroup).super_TestNode.m_testCtx
                     ,local_890,local_8a0);
        }
        local_128 = local_878;
        if (local_878 != local_108) {
          tcu::TestNode::addChild(local_108,local_878);
        }
        for (local_138 = 0; local_138 < 3; local_138 = local_138 + 1) {
          textureTypeGroup._4_4_ = *(TextureType_conflict *)&textureTypes[local_138].name;
          if ((*(TextureType_conflict *)&textureTypes[local_138].name != TEXTURETYPE_CUBE) ||
             ((GatherType)gatherTypeGroup == GATHERTYPE_BASIC)) {
            pTVar12 = (TestNode *)operator_new(0x70);
            tcu::TestCaseGroup::TestCaseGroup
                      ((TestCaseGroup *)pTVar12,(this->super_TestCaseGroup).super_TestNode.m_testCtx
                       ,(char *)formats[(long)local_138 + 3].format,"");
            pTStack_148 = pTVar12;
            tcu::TestNode::addChild(local_128,pTVar12);
            for (format._4_4_ = 0; format._4_4_ < 4; format._4_4_ = format._4_4_ + 1) {
              formatGroup = (TestCaseGroup *)(formats + format._4_4_);
              pTVar12 = (TestNode *)operator_new(0x70);
              tcu::TestCaseGroup::TestCaseGroup
                        ((TestCaseGroup *)pTVar12,
                         (this->super_TestCaseGroup).super_TestNode.m_testCtx,
                         (char *)formats[(long)format._4_4_ + -1].format,"");
              pTStack_160 = pTVar12;
              tcu::TestNode::addChild(pTStack_148,pTVar12);
              for (cornersGroup._4_4_ = 0;
                  cornersGroup._4_4_ <= (int)(uint)(textureTypeGroup._4_4_ == TEXTURETYPE_CUBE);
                  cornersGroup._4_4_ = cornersGroup._4_4_ + 1) {
                cornersGroup._3_1_ = cornersGroup._4_4_ != 0;
                textureSize._7_1_ = 0;
                if (cornersGroup._4_4_ != 0) {
                  local_8c0 = (TestNode *)operator_new(0x70);
                  textureSize._7_1_ = 1;
                  _textureSizeNdx = local_8c0;
                  tcu::TestCaseGroup::TestCaseGroup
                            ((TestCaseGroup *)local_8c0,
                             (this->super_TestCaseGroup).super_TestNode.m_testCtx,"no_corners",
                             "Test case variants that don\'t sample around cube map corners");
                }
                else {
                  local_8c0 = pTStack_160;
                }
                local_170 = local_8c0;
                if (pTStack_160 != local_8c0) {
                  tcu::TestNode::addChild(pTStack_160,local_8c0);
                }
                for (textureSize._0_4_ = 0; (int)textureSize < 2;
                    textureSize._0_4_ = (int)textureSize + 1) {
                  textureSizeGroup = (TestCaseGroup *)(textureSizes + (int)textureSize);
                  pTVar12 = (TestNode *)operator_new(0x70);
                  tcu::TestCaseGroup::TestCaseGroup
                            ((TestCaseGroup *)pTVar12,
                             (this->super_TestCaseGroup).super_TestNode.m_testCtx,
                             *(char **)(textureSizes[(long)(int)textureSize + -1].size.m_data + 2),
                             "");
                  _compareMode = pTVar12;
                  tcu::TestNode::addChild(local_170,pTVar12);
                  for (compareModeGroup._4_4_ = COMPAREMODE_NONE; (int)compareModeGroup._4_4_ < 9;
                      compareModeGroup._4_4_ = compareModeGroup._4_4_ + COMPAREMODE_LESS) {
                    compareModeGroup._0_4_ = compareModeGroup._4_4_;
                    bVar17 = compareModeGroup._4_4_ != COMPAREMODE_NONE;
                    bVar9 = isDepthFormat((TextureFormat *)formatGroup);
                    if ((bVar17 == bVar9) &&
                       ((((CompareMode)compareModeGroup == COMPAREMODE_NONE ||
                         ((CompareMode)compareModeGroup == COMPAREMODE_LESS)) ||
                        ((CompareMode)compareModeGroup == COMPAREMODE_GREATER)))) {
                      local_1a9 = 0;
                      bVar9 = (CompareMode)compareModeGroup != COMPAREMODE_NONE;
                      if (bVar9) {
                        local_8d8 = (TestNode *)operator_new(0x70);
                        local_1a9 = 1;
                        pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
                        local_1a8 = local_8d8;
                        std::__cxx11::string::string((string *)&wrapCaseNdx);
                        std::operator+(&local_1f0,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&wrapCaseNdx,"compare_");
                        pcVar13 = compareModeName((CompareMode)compareModeGroup);
                        std::operator+(&local_1d0,&local_1f0,pcVar13);
                        pcVar13 = (char *)std::__cxx11::string::c_str();
                        tcu::TestCaseGroup::TestCaseGroup
                                  ((TestCaseGroup *)local_8d8,pTVar1,pcVar13,"");
                        local_1a9 = 0;
                      }
                      else {
                        local_8d8 = _compareMode;
                      }
                      local_1a9 = 0;
                      if (bVar9) {
                        std::__cxx11::string::~string((string *)&local_1d0);
                        std::__cxx11::string::~string((string *)&local_1f0);
                        std::__cxx11::string::~string((string *)&wrapCaseNdx);
                      }
                      local_1a0 = local_8d8;
                      if (local_8d8 != _compareMode) {
                        tcu::TestNode::addChild(_compareMode,local_8d8);
                      }
                      for (wrapTNdx = 0; wrapTNdx < 3; wrapTNdx = wrapTNdx + 1) {
                        iVar10 = wrapTNdx + 1 + ((wrapTNdx + 1) / 3) * -3;
                        caseName.field_2._12_4_ = *(undefined4 *)&wrapModes[wrapTNdx].name;
                        caseName.field_2._8_4_ = *(undefined4 *)&wrapModes[iVar10].name;
                        std::__cxx11::string::string((string *)&local_2a8);
                        std::operator+(&local_288,&local_2a8,
                                       *(char **)(&gatherType + (long)wrapTNdx * 4));
                        std::operator+(&local_268,&local_288,"_");
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_248,&local_268,
                                       *(char **)(&gatherType + (long)iVar10 * 4));
                        std::__cxx11::string::~string((string *)&local_268);
                        std::__cxx11::string::~string((string *)&local_288);
                        std::__cxx11::string::~string((string *)&local_2a8);
                        TVar6 = textureTypeGroup._4_4_;
                        pTVar12 = local_1a0;
                        pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
                        pcVar13 = (char *)std::__cxx11::string::c_str();
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_2c8,pcVar13,&local_2c9);
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_2f0,"",&local_2f1);
                        GVar8 = (GatherType)gatherTypeGroup;
                        OVar7 = offsetSizeGroup._4_4_;
                        CVar2 = (CompareMode)compareModeGroup;
                        uVar5 = caseName.field_2._12_4_;
                        uVar3 = caseName.field_2._8_4_;
                        local_300 = (TextureFormat)(formatGroup->super_TestNode)._vptr_TestNode;
                        MaybeTextureSwizzle::createNoneTextureSwizzle();
                        pTVar14 = (TestNode *)
                                  makeTextureGatherCase
                                            (TVar6,pTVar1,&local_2c8,&local_2f0,GVar8,OVar7,
                                             local_300,CVar2,uVar5,uVar3,&local_314,NEAREST,NEAREST,
                                             0,(IVec3 *)textureSizeGroup,cornersGroup._3_1_ & 1,
                                             IMAGE_BACKING_MODE_REGULAR);
                        tcu::TestNode::addChild(pTVar12,pTVar14);
                        std::__cxx11::string::~string((string *)&local_2f0);
                        std::allocator<char>::~allocator(&local_2f1);
                        std::__cxx11::string::~string((string *)&local_2c8);
                        std::allocator<char>::~allocator(&local_2c9);
                        TVar6 = textureTypeGroup._4_4_;
                        pTVar12 = local_1a0;
                        pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
                        std::operator+(&local_338,"sparse_",
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_248);
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_358,"",&local_359);
                        GVar8 = (GatherType)gatherTypeGroup;
                        OVar7 = offsetSizeGroup._4_4_;
                        CVar2 = (CompareMode)compareModeGroup;
                        uVar5 = caseName.field_2._12_4_;
                        uVar3 = caseName.field_2._8_4_;
                        local_368 = (TextureFormat)(formatGroup->super_TestNode)._vptr_TestNode;
                        MaybeTextureSwizzle::createNoneTextureSwizzle();
                        pTVar14 = (TestNode *)
                                  makeTextureGatherCase
                                            (TVar6,pTVar1,&local_338,&local_358,GVar8,OVar7,
                                             local_368,CVar2,uVar5,uVar3,
                                             (MaybeTextureSwizzle *)((long)&swizzleGroup + 4),
                                             NEAREST,NEAREST,0,(IVec3 *)textureSizeGroup,
                                             cornersGroup._3_1_ & 1,IMAGE_BACKING_MODE_SPARSE);
                        tcu::TestNode::addChild(pTVar12,pTVar14);
                        std::__cxx11::string::~string((string *)&local_358);
                        std::allocator<char>::~allocator(&local_359);
                        std::__cxx11::string::~string((string *)&local_338);
                        std::__cxx11::string::~string((string *)local_248);
                      }
                    }
                  }
                }
              }
              if ((offsetSizeGroup._4_4_ != OFFSETSIZE_MINIMUM_REQUIRED) ||
                 ((GatherType)gatherTypeGroup == GATHERTYPE_OFFSETS)) {
                bVar9 = isDepthFormat((TextureFormat *)formatGroup);
                if (!bVar9) {
                  pTVar12 = (TestNode *)operator_new(0x70);
                  tcu::TestCaseGroup::TestCaseGroup
                            ((TestCaseGroup *)pTVar12,
                             (this->super_TestCaseGroup).super_TestNode.m_testCtx,"texture_swizzle",
                             "");
                  tcu::TestNode::addChild(pTStack_160,pTVar12);
                  for (swizzle.m_swizzle.m_data[3] = TEXTURESWIZZLECOMPONENT_R;
                      (int)swizzle.m_swizzle.m_data[3] < 6;
                      swizzle.m_swizzle.m_data[3] =
                           swizzle.m_swizzle.m_data[3] + TEXTURESWIZZLECOMPONENT_G) {
                    MaybeTextureSwizzle::createSomeTextureSwizzle();
                    std::__cxx11::string::string((string *)local_3c0);
                    for (local_3c4 = 0; TVar6 = textureTypeGroup._4_4_, local_3c4 < 4;
                        local_3c4 = local_3c4 + 1) {
                      iVar10 = swizzle.m_swizzle.m_data[3] + local_3c4;
                      pVVar15 = MaybeTextureSwizzle::getSwizzle
                                          ((MaybeTextureSwizzle *)((long)&caseName_1.field_2 + 8));
                      pTVar16 = tcu::
                                Vector<vkt::sr::(anonymous_namespace)::TextureSwizzleComponent,_4>::
                                operator[](pVVar15,local_3c4);
                      *pTVar16 = iVar10 % 6;
                      pcVar13 = "";
                      if (0 < local_3c4) {
                        pcVar13 = "_";
                      }
                      pVVar15 = MaybeTextureSwizzle::getSwizzle
                                          ((MaybeTextureSwizzle *)((long)&caseName_1.field_2 + 8));
                      pTVar16 = tcu::
                                Vector<vkt::sr::(anonymous_namespace)::TextureSwizzleComponent,_4>::
                                operator[](pVVar15,local_3c4);
                      de::toString<vkt::sr::(anonymous_namespace)::TextureSwizzleComponent>
                                (&local_428,pTVar16);
                      de::toLower(&local_408,&local_428);
                      std::operator+(&local_3e8,pcVar13,&local_408);
                      std::__cxx11::string::operator+=((string *)local_3c0,(string *)&local_3e8);
                      std::__cxx11::string::~string((string *)&local_3e8);
                      std::__cxx11::string::~string((string *)&local_408);
                      std::__cxx11::string::~string((string *)&local_428);
                    }
                    pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
                    pcVar13 = (char *)std::__cxx11::string::c_str();
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_448,pcVar13,&local_449);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_470,"",&local_471);
                    GVar8 = (GatherType)gatherTypeGroup;
                    OVar7 = offsetSizeGroup._4_4_;
                    local_480 = (TextureFormat)(formatGroup->super_TestNode)._vptr_TestNode;
                    tcu::Vector<int,_3>::Vector(&local_48c,0x40,0x40,3);
                    pTVar14 = (TestNode *)
                              makeTextureGatherCase
                                        (TVar6,pTVar1,&local_448,&local_470,GVar8,OVar7,local_480,
                                         COMPAREMODE_NONE,REPEAT_GL,REPEAT_GL,
                                         (MaybeTextureSwizzle *)((long)&caseName_1.field_2 + 8),
                                         NEAREST,NEAREST,0,&local_48c,0,IMAGE_BACKING_MODE_REGULAR);
                    tcu::TestNode::addChild(pTVar12,pTVar14);
                    std::__cxx11::string::~string((string *)&local_470);
                    std::allocator<char>::~allocator(&local_471);
                    std::__cxx11::string::~string((string *)&local_448);
                    std::allocator<char>::~allocator(&local_449);
                    TVar6 = textureTypeGroup._4_4_;
                    pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
                    std::operator+(&local_4b0,"sparse_",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_3c0);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_4d0,"",&local_4d1);
                    GVar8 = (GatherType)gatherTypeGroup;
                    OVar7 = offsetSizeGroup._4_4_;
                    local_4e0 = (TextureFormat)(formatGroup->super_TestNode)._vptr_TestNode;
                    tcu::Vector<int,_3>::Vector
                              ((Vector<int,_3> *)((long)&filterModeGroup + 4),0x40,0x40,3);
                    pTVar14 = (TestNode *)
                              makeTextureGatherCase
                                        (TVar6,pTVar1,&local_4b0,&local_4d0,GVar8,OVar7,local_4e0,
                                         COMPAREMODE_NONE,REPEAT_GL,REPEAT_GL,
                                         (MaybeTextureSwizzle *)((long)&caseName_1.field_2 + 8),
                                         NEAREST,NEAREST,0,(IVec3 *)((long)&filterModeGroup + 4),0,
                                         IMAGE_BACKING_MODE_SPARSE);
                    tcu::TestNode::addChild(pTVar12,pTVar14);
                    std::__cxx11::string::~string((string *)&local_4d0);
                    std::allocator<char>::~allocator(&local_4d1);
                    std::__cxx11::string::~string((string *)&local_4b0);
                    std::__cxx11::string::~string((string *)local_3c0);
                  }
                }
                pTVar12 = (TestNode *)operator_new(0x70);
                tcu::TestCaseGroup::TestCaseGroup
                          ((TestCaseGroup *)pTVar12,
                           (this->super_TestCaseGroup).super_TestNode.m_testCtx,"filter_mode",
                           "Test that filter modes have no effect");
                magFilters[1]._8_8_ = pTVar12;
                tcu::TestNode::addChild(pTStack_160,pTVar12);
                minFilters[4]._8_8_ = (long)"_tiling_linear" + 8;
                magFilters[0].name = (char *)0x1;
                magFilters[0]._8_8_ = (long)"linear_mipmap_nearest" + 0xe;
                magFilters[1].name = (char *)0x0;
                memcpy(&magFilterNdx,&DAT_01665e20,0x50);
                for (minFilter = NEAREST; (int)minFilter < 5; minFilter = minFilter + LINEAR) {
                  for (magFilter = NEAREST; (int)magFilter < 2; magFilter = magFilter + LINEAR) {
                    minFilter_00 = *(FilterMode *)&minFilters[(int)minFilter].name;
                    magFilter_00 = *(FilterMode *)&magFilters[(int)magFilter].name;
                    bVar9 = isDepthFormat((TextureFormat *)formatGroup);
                    caseName_2.field_2._12_4_ = ZEXT14(bVar9);
                    bVar9 = isUnormFormatType(*(ChannelType *)
                                               ((long)&(formatGroup->super_TestNode)._vptr_TestNode
                                               + 4));
                    if ((((!bVar9) && (bVar9 = isDepthFormat((TextureFormat *)formatGroup), !bVar9))
                        || (magFilter_00 != NEAREST)) &&
                       (((bVar9 = isUIntFormatType(*(ChannelType *)
                                                    ((long)&(formatGroup->super_TestNode).
                                                            _vptr_TestNode + 4)), !bVar9 &&
                         (bVar9 = isSIntFormatType(*(ChannelType *)
                                                    ((long)&(formatGroup->super_TestNode).
                                                            _vptr_TestNode + 4)), !bVar9)) ||
                        ((magFilter_00 == NEAREST && (minFilter_00 == NEAREST_MIPMAP_NEAREST)))))) {
                      std::__cxx11::string::string((string *)&local_620);
                      std::operator+(&local_600,&local_620,"min_");
                      std::operator+(&local_5e0,&local_600,
                                     *(char **)(&magFilterNdx + (long)(int)minFilter * 4));
                      std::operator+(&local_5c0,&local_5e0,"_mag_");
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_5a0,&local_5c0,
                                     *(char **)&minFilters[(long)(int)magFilter + 4].filter);
                      std::__cxx11::string::~string((string *)&local_5c0);
                      std::__cxx11::string::~string((string *)&local_5e0);
                      std::__cxx11::string::~string((string *)&local_600);
                      std::__cxx11::string::~string((string *)&local_620);
                      TVar6 = textureTypeGroup._4_4_;
                      uVar4 = magFilters[1]._8_8_;
                      pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
                      pcVar13 = (char *)std::__cxx11::string::c_str();
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_640,pcVar13,&local_641);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_668,"",&local_669);
                      GVar8 = (GatherType)gatherTypeGroup;
                      OVar7 = offsetSizeGroup._4_4_;
                      uVar3 = caseName_2.field_2._12_4_;
                      local_678 = (TextureFormat)(formatGroup->super_TestNode)._vptr_TestNode;
                      MaybeTextureSwizzle::createNoneTextureSwizzle();
                      tcu::Vector<int,_3>::Vector(&local_698,0x40,0x40,3);
                      pTVar12 = (TestNode *)
                                makeTextureGatherCase
                                          (TVar6,pTVar1,&local_640,&local_668,GVar8,OVar7,local_678,
                                           uVar3,REPEAT_GL,REPEAT_GL,&local_68c,minFilter_00,
                                           magFilter_00,0,&local_698,0,IMAGE_BACKING_MODE_REGULAR);
                      tcu::TestNode::addChild((TestNode *)uVar4,pTVar12);
                      std::__cxx11::string::~string((string *)&local_668);
                      std::allocator<char>::~allocator(&local_669);
                      std::__cxx11::string::~string((string *)&local_640);
                      std::allocator<char>::~allocator(&local_641);
                      TVar6 = textureTypeGroup._4_4_;
                      uVar4 = magFilters[1]._8_8_;
                      pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
                      std::operator+(&local_6b8,"sparse_",
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_5a0);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_6d8,"",&local_6d9);
                      GVar8 = (GatherType)gatherTypeGroup;
                      OVar7 = offsetSizeGroup._4_4_;
                      uVar3 = caseName_2.field_2._12_4_;
                      local_6e8 = (TextureFormat)(formatGroup->super_TestNode)._vptr_TestNode;
                      MaybeTextureSwizzle::createNoneTextureSwizzle();
                      tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&baseLevelGroup,0x40,0x40,3);
                      pTVar12 = (TestNode *)
                                makeTextureGatherCase
                                          (TVar6,pTVar1,&local_6b8,&local_6d8,GVar8,OVar7,local_6e8,
                                           uVar3,REPEAT_GL,REPEAT_GL,&local_6fc,minFilter_00,
                                           magFilter_00,0,(IVec3 *)&baseLevelGroup,0,
                                           IMAGE_BACKING_MODE_SPARSE);
                      tcu::TestNode::addChild((TestNode *)uVar4,pTVar12);
                      std::__cxx11::string::~string((string *)&local_6d8);
                      std::allocator<char>::~allocator(&local_6d9);
                      std::__cxx11::string::~string((string *)&local_6b8);
                      std::__cxx11::string::~string((string *)local_5a0);
                    }
                  }
                }
                pTVar12 = (TestNode *)operator_new(0x70);
                tcu::TestCaseGroup::TestCaseGroup
                          ((TestCaseGroup *)pTVar12,
                           (this->super_TestCaseGroup).super_TestNode.m_testCtx,"base_level","");
                tcu::TestNode::addChild(pTStack_160,pTVar12);
                for (caseName_3.field_2._12_4_ = 1; (int)caseName_3.field_2._12_4_ < 3;
                    caseName_3.field_2._12_4_ = caseName_3.field_2._12_4_ + 1) {
                  de::toString<int>((string *)local_758,
                                    (int *)(caseName_3.field_2._M_local_buf + 0xc));
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_738,"level_",(string *)local_758);
                  std::__cxx11::string::~string((string *)local_758);
                  bVar9 = isDepthFormat((TextureFormat *)formatGroup);
                  TVar6 = textureTypeGroup._4_4_;
                  local_75c = (CompareMode)bVar9;
                  pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
                  pcVar13 = (char *)std::__cxx11::string::c_str();
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_780,pcVar13,&local_781);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_7a8,"",&local_7a9);
                  GVar8 = (GatherType)gatherTypeGroup;
                  OVar7 = offsetSizeGroup._4_4_;
                  CVar2 = local_75c;
                  local_7b8 = (TextureFormat)(formatGroup->super_TestNode)._vptr_TestNode;
                  MaybeTextureSwizzle::createNoneTextureSwizzle();
                  uVar3 = caseName_3.field_2._12_4_;
                  tcu::Vector<int,_3>::Vector(&local_7d8,0x40,0x40,3);
                  pTVar14 = (TestNode *)
                            makeTextureGatherCase
                                      (TVar6,pTVar1,&local_780,&local_7a8,GVar8,OVar7,local_7b8,
                                       CVar2,REPEAT_GL,REPEAT_GL,&local_7cc,NEAREST,NEAREST,uVar3,
                                       &local_7d8,0,IMAGE_BACKING_MODE_REGULAR);
                  tcu::TestNode::addChild(pTVar12,pTVar14);
                  std::__cxx11::string::~string((string *)&local_7a8);
                  std::allocator<char>::~allocator(&local_7a9);
                  std::__cxx11::string::~string((string *)&local_780);
                  std::allocator<char>::~allocator(&local_781);
                  TVar6 = textureTypeGroup._4_4_;
                  pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
                  std::operator+(&local_7f8,"sparse_",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_738);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_818,"",&local_819);
                  GVar8 = (GatherType)gatherTypeGroup;
                  OVar7 = offsetSizeGroup._4_4_;
                  CVar2 = local_75c;
                  local_828 = (TextureFormat)(formatGroup->super_TestNode)._vptr_TestNode;
                  MaybeTextureSwizzle::createNoneTextureSwizzle();
                  uVar3 = caseName_3.field_2._12_4_;
                  tcu::Vector<int,_3>::Vector(&local_848,0x40,0x40,3);
                  pTVar14 = (TestNode *)
                            makeTextureGatherCase
                                      (TVar6,pTVar1,&local_7f8,&local_818,GVar8,OVar7,local_828,
                                       CVar2,REPEAT_GL,REPEAT_GL,&local_83c,NEAREST,NEAREST,uVar3,
                                       &local_848,0,IMAGE_BACKING_MODE_SPARSE);
                  tcu::TestNode::addChild(pTVar12,pTVar14);
                  std::__cxx11::string::~string((string *)&local_818);
                  std::allocator<char>::~allocator(&local_819);
                  std::__cxx11::string::~string((string *)&local_7f8);
                  std::__cxx11::string::~string((string *)local_738);
                }
              }
            }
          }
        }
      }
    }
    gatherTypeGroup._4_4_ = gatherTypeGroup._4_4_ + GATHERTYPE_OFFSET;
    pvVar11 = (void *)(ulong)gatherTypeGroup._4_4_;
  }
  return (int)pvVar11;
}

Assistant:

void TextureGatherTests::init (void)
{
	const struct
	{
		const char* name;
		TextureType type;
	} textureTypes[] =
	{
		{ "2d",			TEXTURETYPE_2D			},
		{ "2d_array",	TEXTURETYPE_2D_ARRAY	},
		{ "cube",		TEXTURETYPE_CUBE		}
	};

	const struct
	{
		const char*			name;
		tcu::TextureFormat	format;
	} formats[] =
	{
		{ "rgba8",		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::UNORM_INT8)		},
		{ "rgba8ui",	tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::UNSIGNED_INT8)	},
		{ "rgba8i",		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::SIGNED_INT8)	},
		{ "depth32f",	tcu::TextureFormat(tcu::TextureFormat::D,		tcu::TextureFormat::FLOAT)			}
	};

	const struct
	{
		const char*		name;
		IVec3			size;
	} textureSizes[] =
	{
		{ "size_pot",	IVec3(64, 64, 3) },
		{ "size_npot",	IVec3(17, 23, 3) }
	};

	const struct
	{
		const char*				name;
		tcu::Sampler::WrapMode	mode;
	} wrapModes[] =
	{
		{ "clamp_to_edge",		tcu::Sampler::CLAMP_TO_EDGE			},
		{ "repeat",				tcu::Sampler::REPEAT_GL				},
		{ "mirrored_repeat",	tcu::Sampler::MIRRORED_REPEAT_GL	}
	};

	for (int gatherTypeI = 0; gatherTypeI < GATHERTYPE_LAST; gatherTypeI++)
	{
		const GatherType		gatherType			= (GatherType)gatherTypeI;
		TestCaseGroup* const	gatherTypeGroup		= new TestCaseGroup(m_testCtx, gatherTypeName(gatherType), gatherTypeDescription(gatherType));
		addChild(gatherTypeGroup);

		for (int offsetSizeI = 0; offsetSizeI < OFFSETSIZE_LAST; offsetSizeI++)
		{
			const OffsetSize offsetSize = (OffsetSize)offsetSizeI;
			if ((gatherType == GATHERTYPE_BASIC) != (offsetSize == OFFSETSIZE_NONE))
				continue;

			if (gatherType == GATHERTYPE_OFFSETS && offsetSize == OFFSETSIZE_IMPLEMENTATION_MAXIMUM) // \note offsets argument must be compile-time constant
				continue;

			TestCaseGroup* const offsetSizeGroup = offsetSize == OFFSETSIZE_NONE ?
													gatherTypeGroup :
													new TestCaseGroup(m_testCtx,
																	  offsetSize == OFFSETSIZE_MINIMUM_REQUIRED				? "min_required_offset"
																	  : offsetSize == OFFSETSIZE_IMPLEMENTATION_MAXIMUM		? "implementation_offset"
																	  : DE_NULL,
																	  offsetSize == OFFSETSIZE_MINIMUM_REQUIRED				? "Use offsets within Vulkan minimum required range"
																	  : offsetSize == OFFSETSIZE_IMPLEMENTATION_MAXIMUM		? "Use offsets within the implementation range"
																	  : DE_NULL);

			if (offsetSizeGroup != gatherTypeGroup)
				gatherTypeGroup->addChild(offsetSizeGroup);

			for (int textureTypeNdx = 0; textureTypeNdx < DE_LENGTH_OF_ARRAY(textureTypes); textureTypeNdx++)
			{
				const TextureType textureType = textureTypes[textureTypeNdx].type;

				if (textureType == TEXTURETYPE_CUBE && gatherType != GATHERTYPE_BASIC)
					continue;

				TestCaseGroup* const textureTypeGroup = new TestCaseGroup(m_testCtx, textureTypes[textureTypeNdx].name, "");
				offsetSizeGroup->addChild(textureTypeGroup);

				for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(formats); formatNdx++)
				{
					const tcu::TextureFormat&	format			= formats[formatNdx].format;
					TestCaseGroup* const		formatGroup		= new TestCaseGroup(m_testCtx, formats[formatNdx].name, "");
					textureTypeGroup->addChild(formatGroup);

					for (int noCornersI = 0; noCornersI <= ((textureType == TEXTURETYPE_CUBE)?1:0); noCornersI++)
					{
						const bool				noCorners		= noCornersI!= 0;
						TestCaseGroup* const	cornersGroup	= noCorners
																? new TestCaseGroup(m_testCtx, "no_corners", "Test case variants that don't sample around cube map corners")
																: formatGroup;

						if (formatGroup != cornersGroup)
							formatGroup->addChild(cornersGroup);

						for (int textureSizeNdx = 0; textureSizeNdx < DE_LENGTH_OF_ARRAY(textureSizes); textureSizeNdx++)
						{
							const IVec3&			textureSize			= textureSizes[textureSizeNdx].size;
							TestCaseGroup* const	textureSizeGroup	= new TestCaseGroup(m_testCtx, textureSizes[textureSizeNdx].name, "");
							cornersGroup->addChild(textureSizeGroup);

							for (int compareModeI = 0; compareModeI < tcu::Sampler::COMPAREMODE_LAST; compareModeI++)
							{
								const tcu::Sampler::CompareMode compareMode = (tcu::Sampler::CompareMode)compareModeI;

								if ((compareMode != tcu::Sampler::COMPAREMODE_NONE) != isDepthFormat(format))
									continue;

								if (compareMode != tcu::Sampler::COMPAREMODE_NONE &&
									compareMode != tcu::Sampler::COMPAREMODE_LESS &&
									compareMode != tcu::Sampler::COMPAREMODE_GREATER)
									continue;

								TestCaseGroup* const compareModeGroup = compareMode == tcu::Sampler::COMPAREMODE_NONE ?
																			textureSizeGroup :
																			new TestCaseGroup(m_testCtx,
																							  (string() + "compare_" + compareModeName(compareMode)).c_str(),
																							  "");
								if (compareModeGroup != textureSizeGroup)
									textureSizeGroup->addChild(compareModeGroup);

								for (int wrapCaseNdx = 0; wrapCaseNdx < DE_LENGTH_OF_ARRAY(wrapModes); wrapCaseNdx++)
								{
									const int						wrapSNdx	= wrapCaseNdx;
									const int						wrapTNdx	= (wrapCaseNdx + 1) % DE_LENGTH_OF_ARRAY(wrapModes);
									const tcu::Sampler::WrapMode	wrapS		= wrapModes[wrapSNdx].mode;
									const tcu::Sampler::WrapMode	wrapT		= wrapModes[wrapTNdx].mode;

									const string caseName = string() + wrapModes[wrapSNdx].name + "_" + wrapModes[wrapTNdx].name;

									compareModeGroup->addChild(makeTextureGatherCase(textureType, m_testCtx, caseName.c_str(), "", gatherType, offsetSize, format, compareMode, wrapS, wrapT,
																					 MaybeTextureSwizzle::createNoneTextureSwizzle(), tcu::Sampler::NEAREST, tcu::Sampler::NEAREST, 0, textureSize,
																					 noCorners ? GATHERCASE_DONT_SAMPLE_CUBE_CORNERS : 0));
									compareModeGroup->addChild(makeTextureGatherCase(textureType, m_testCtx, "sparse_" + caseName, "", gatherType, offsetSize, format, compareMode, wrapS, wrapT,
																					 MaybeTextureSwizzle::createNoneTextureSwizzle(), tcu::Sampler::NEAREST, tcu::Sampler::NEAREST, 0, textureSize,
																					 noCorners ? GATHERCASE_DONT_SAMPLE_CUBE_CORNERS : 0, ShaderRenderCaseInstance::IMAGE_BACKING_MODE_SPARSE));
								}
							}
						}
					}

					if (offsetSize != OFFSETSIZE_MINIMUM_REQUIRED || gatherType == GATHERTYPE_OFFSETS) // Don't test all features for both offset size types, as they should be rather orthogonal.
					{
						if (!isDepthFormat(format))
						{
							TestCaseGroup* const swizzleGroup = new TestCaseGroup(m_testCtx, "texture_swizzle", "");
							formatGroup->addChild(swizzleGroup);

							DE_STATIC_ASSERT(TEXTURESWIZZLECOMPONENT_R == 0);
							for (int swizzleCaseNdx = 0; swizzleCaseNdx < TEXTURESWIZZLECOMPONENT_LAST; swizzleCaseNdx++)
							{
								MaybeTextureSwizzle	swizzle	= MaybeTextureSwizzle::createSomeTextureSwizzle();
								string				caseName;

								for (int i = 0; i < 4; i++)
								{
									swizzle.getSwizzle()[i] = (TextureSwizzleComponent)((swizzleCaseNdx + i) % (int)TEXTURESWIZZLECOMPONENT_LAST);
									caseName += (i > 0 ? "_" : "") + de::toLower(de::toString(swizzle.getSwizzle()[i]));
								}

								swizzleGroup->addChild(makeTextureGatherCase(textureType, m_testCtx, caseName.c_str(), "", gatherType, offsetSize, format,
																			 tcu::Sampler::COMPAREMODE_NONE, tcu::Sampler::REPEAT_GL, tcu::Sampler::REPEAT_GL,
																			 swizzle, tcu::Sampler::NEAREST, tcu::Sampler::NEAREST, 0, IVec3(64, 64, 3)));
								swizzleGroup->addChild(makeTextureGatherCase(textureType, m_testCtx, "sparse_" + caseName, "", gatherType, offsetSize, format,
																			 tcu::Sampler::COMPAREMODE_NONE, tcu::Sampler::REPEAT_GL, tcu::Sampler::REPEAT_GL,
																			 swizzle, tcu::Sampler::NEAREST, tcu::Sampler::NEAREST, 0, IVec3(64, 64, 3), 0, ShaderRenderCaseInstance::IMAGE_BACKING_MODE_SPARSE));
							}
						}

						{
							TestCaseGroup* const filterModeGroup = new TestCaseGroup(m_testCtx, "filter_mode", "Test that filter modes have no effect");
							formatGroup->addChild(filterModeGroup);

							const struct
							{
								const char*					name;
								tcu::Sampler::FilterMode	filter;
							} magFilters[] =
							{
								{ "linear",		tcu::Sampler::LINEAR	},
								{ "nearest",	tcu::Sampler::NEAREST	}
							};

							const struct
							{
								const char*					name;
								tcu::Sampler::FilterMode	filter;
							} minFilters[] =
							{
								// \note Don't test NEAREST here, as it's covered by other cases.
								{ "linear",						tcu::Sampler::LINEAR					},
								{ "nearest_mipmap_nearest",		tcu::Sampler::NEAREST_MIPMAP_NEAREST	},
								{ "nearest_mipmap_linear",		tcu::Sampler::NEAREST_MIPMAP_LINEAR		},
								{ "linear_mipmap_nearest",		tcu::Sampler::LINEAR_MIPMAP_NEAREST		},
								{ "linear_mipmap_linear",		tcu::Sampler::LINEAR_MIPMAP_LINEAR		},
							};

							for (int minFilterNdx = 0; minFilterNdx < DE_LENGTH_OF_ARRAY(minFilters); minFilterNdx++)
							for (int magFilterNdx = 0; magFilterNdx < DE_LENGTH_OF_ARRAY(magFilters); magFilterNdx++)
							{
								const tcu::Sampler::FilterMode		minFilter		= minFilters[minFilterNdx].filter;
								const tcu::Sampler::FilterMode		magFilter		= magFilters[magFilterNdx].filter;
								const tcu::Sampler::CompareMode		compareMode		= isDepthFormat(format) ? tcu::Sampler::COMPAREMODE_LESS : tcu::Sampler::COMPAREMODE_NONE;

								if ((isUnormFormatType(format.type) || isDepthFormat(format)) && magFilter == tcu::Sampler::NEAREST)
									continue; // Covered by other cases.
								if ((isUIntFormatType(format.type) || isSIntFormatType(format.type)) &&
									(magFilter != tcu::Sampler::NEAREST || minFilter != tcu::Sampler::NEAREST_MIPMAP_NEAREST))
									continue;

								const string caseName = string() + "min_" + minFilters[minFilterNdx].name + "_mag_" + magFilters[magFilterNdx].name;

								filterModeGroup->addChild(makeTextureGatherCase(textureType, m_testCtx, caseName.c_str(), "", gatherType, offsetSize, format, compareMode,
																				tcu::Sampler::REPEAT_GL, tcu::Sampler::REPEAT_GL, MaybeTextureSwizzle::createNoneTextureSwizzle(),
																				minFilter, magFilter, 0, IVec3(64, 64, 3)));
								filterModeGroup->addChild(makeTextureGatherCase(textureType, m_testCtx, "sparse_" + caseName, "", gatherType, offsetSize, format, compareMode,
																				tcu::Sampler::REPEAT_GL, tcu::Sampler::REPEAT_GL, MaybeTextureSwizzle::createNoneTextureSwizzle(),
																				minFilter, magFilter, 0, IVec3(64, 64, 3), 0, ShaderRenderCaseInstance::IMAGE_BACKING_MODE_SPARSE));
							}
						}

						{
							TestCaseGroup* const baseLevelGroup = new TestCaseGroup(m_testCtx, "base_level", "");
							formatGroup->addChild(baseLevelGroup);

							for (int baseLevel = 1; baseLevel <= 2; baseLevel++)
							{
								const string						caseName		= "level_" + de::toString(baseLevel);
								const tcu::Sampler::CompareMode		compareMode		= isDepthFormat(format) ? tcu::Sampler::COMPAREMODE_LESS : tcu::Sampler::COMPAREMODE_NONE;
								baseLevelGroup->addChild(makeTextureGatherCase(textureType, m_testCtx, caseName.c_str(), "", gatherType, offsetSize, format,
																			   compareMode, tcu::Sampler::REPEAT_GL, tcu::Sampler::REPEAT_GL,
																			   MaybeTextureSwizzle::createNoneTextureSwizzle(), tcu::Sampler::NEAREST, tcu::Sampler::NEAREST,
																			   baseLevel, IVec3(64, 64, 3)));
								baseLevelGroup->addChild(makeTextureGatherCase(textureType, m_testCtx, "sparse_" + caseName, "", gatherType, offsetSize, format,
																			   compareMode, tcu::Sampler::REPEAT_GL, tcu::Sampler::REPEAT_GL,
																			   MaybeTextureSwizzle::createNoneTextureSwizzle(), tcu::Sampler::NEAREST, tcu::Sampler::NEAREST,
																			   baseLevel, IVec3(64, 64, 3), 0, ShaderRenderCaseInstance::IMAGE_BACKING_MODE_SPARSE));
							}
						}
					}
				}
			}
		}
	}
}